

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall LLVMBC::ModuleParseContext::add_successor(ModuleParseContext *this,BasicBlock *bb)

{
  undefined8 uVar1;
  void *pvVar2;
  char local_1028 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  BasicBlock *bb_local;
  ModuleParseContext *this_local;
  
  if (this->current_bb == (BasicBlock *)0x0) {
    buffer._4088_8_ = dxil_spv::get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: No basic block is active in add_successor().\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1028,0x1000,"No basic block is active in add_successor().\n");
      uVar1 = buffer._4088_8_;
      pvVar2 = dxil_spv::get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar2,2,local_1028);
    }
    this_local._7_1_ = false;
  }
  else {
    BasicBlock::add_successor(this->current_bb,bb);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ModuleParseContext::add_successor(BasicBlock *bb)
{
	if (!current_bb)
	{
		LOGE("No basic block is active in add_successor().\n");
		return false;
	}

	current_bb->add_successor(bb);
	return true;
}